

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

CBComment * __thiscall asmjit::CodeBuilder::newCommentNode(CodeBuilder *this,char *s,size_t len)

{
  int iVar1;
  undefined4 extraout_var;
  CBComment *pCVar2;
  ushort uVar3;
  size_t sStack_18;
  
  if (s == (char *)0x0) {
    s = (char *)0x0;
  }
  else {
    if (len == 0xffffffffffffffff) {
      len = strlen(s);
    }
    if (len != 0) {
      iVar1 = Zone::dup(&this->_cbDataZone,(int)s);
      s = (char *)CONCAT44(extraout_var,iVar1);
      if (s == (char *)0x0) {
        return (CBComment *)0x0;
      }
    }
  }
  if ((this->_cbHeap)._zone != (Zone *)0x0) {
    pCVar2 = (CBComment *)ZoneHeap::_alloc(&this->_cbHeap,0x28,&sStack_18);
    (pCVar2->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar2->super_CBNode)._next = (CBNode *)0x0;
    (pCVar2->super_CBNode)._type = '\a';
    (pCVar2->super_CBNode)._opCount = '\0';
    uVar3 = (ushort)this->_nodeFlags;
    (pCVar2->super_CBNode)._flags = uVar3;
    (pCVar2->super_CBNode)._position = this->_position;
    (pCVar2->super_CBNode)._inlineComment = (char *)0x0;
    (pCVar2->super_CBNode)._passData = (void *)0x0;
    (pCVar2->super_CBNode)._flags = uVar3 | 0xc;
    (pCVar2->super_CBNode)._inlineComment = s;
    return pCVar2;
  }
  newCommentNode();
}

Assistant:

CBComment* CodeBuilder::newCommentNode(const char* s, size_t len) noexcept {
  if (s) {
    if (len == Globals::kInvalidIndex) len = ::strlen(s);
    if (len > 0) {
      s = static_cast<char*>(_cbDataZone.dup(s, len, true));
      if (!s) return nullptr;
    }
  }

  return newNodeT<CBComment>(s);
}